

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

void __thiscall irr::scene::CSceneManager::~CSceneManager(CSceneManager *this)

{
  ~CSceneManager((CSceneManager *)&this[-1].field_0x250);
  return;
}

Assistant:

CSceneManager::~CSceneManager()
{
	clearDeletionList();

	//! force to remove hardwareTextures from the driver
	//! because Scenes may hold internally data bounded to sceneNodes
	//! which may be destroyed twice
	if (Driver)
		Driver->removeAllHardwareBuffers();

	if (CursorControl)
		CursorControl->drop();

	if (CollisionManager)
		CollisionManager->drop();

	u32 i;
	for (i = 0; i < MeshLoaderList.size(); ++i)
		MeshLoaderList[i]->drop();

	if (ActiveCamera)
		ActiveCamera->drop();
	ActiveCamera = 0;

	if (MeshCache)
		MeshCache->drop();

	if (Parameters)
		Parameters->drop();

	// remove all nodes before dropping the driver
	// as render targets may be destroyed twice

	removeAll();

	if (Driver)
		Driver->drop();
}